

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O1

vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_> *
__thiscall
program_options::command_line_parser::run_impl
          (vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
           *__return_storage_ptr__,command_line_parser *this)

{
  style_t sVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  option_description *this_00;
  int *piVar11;
  pointer pbVar12;
  too_many_positional_options_error *this_01;
  long lVar13;
  byte bVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  pointer pbVar19;
  byte bVar20;
  bool bVar21;
  bool bVar22;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  *result;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  result2;
  vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  style_parsers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  e;
  _Any_data local_d8;
  undefined1 local_c8 [32];
  positional_options_description *ppStack_a8;
  undefined8 local_a0;
  undefined1 auStack_98 [32];
  vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_78.
  super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->m_style & allow_long) != 0) {
    local_d8._8_8_ = 0;
    local_c8._8_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:86:21)>
         ::_M_invoke;
    local_c8._0_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:86:21)>
         ::_M_manager;
    local_d8._M_unused._M_object = this;
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
    ::
    emplace_back<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>
              ((vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
                *)&local_78,
               (function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&local_d8);
    if ((pointer)local_c8._0_8_ != (pointer)0x0) {
      (*(code *)local_c8._0_8_)(&local_d8,&local_d8,3);
    }
  }
  if ((this->m_style & allow_long_disguise) != 0) {
    local_d8._8_8_ = 0;
    local_c8._8_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:93:21)>
         ::_M_invoke;
    local_c8._0_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:93:21)>
         ::_M_manager;
    local_d8._M_unused._M_object = this;
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
    ::
    emplace_back<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>
              ((vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
                *)&local_78,
               (function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&local_d8);
    if ((pointer)local_c8._0_8_ != (pointer)0x0) {
      (*(code *)local_c8._0_8_)(&local_d8,&local_d8,3);
    }
  }
  if ((~this->m_style & 6) == 0) {
    local_d8._8_8_ = 0;
    local_c8._8_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:100:21)>
         ::_M_invoke;
    local_c8._0_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:100:21)>
         ::_M_manager;
    local_d8._M_unused._M_object = this;
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
    ::
    emplace_back<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>
              ((vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
                *)&local_78,
               (function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&local_d8);
    if ((pointer)local_c8._0_8_ != (pointer)0x0) {
      (*(code *)local_c8._0_8_)(&local_d8,&local_d8,3);
    }
  }
  if ((~this->m_style & 10) == 0) {
    local_d8._8_8_ = 0;
    local_c8._8_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:107:21)>
         ::_M_invoke;
    local_c8._0_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:107:21)>
         ::_M_manager;
    local_d8._M_unused._M_object = this;
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
    ::
    emplace_back<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>
              ((vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
                *)&local_78,
               (function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&local_d8);
    if ((pointer)local_c8._0_8_ != (pointer)0x0) {
      (*(code *)local_c8._0_8_)(&local_d8,&local_d8,3);
    }
  }
  local_d8._8_8_ = (command_line_parser *)0x0;
  local_c8._8_8_ =
       std::
       _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:113:17)>
       ::_M_invoke;
  local_c8._0_8_ =
       std::
       _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:113:17)>
       ::_M_manager;
  local_d8._M_unused._M_object = this;
  std::
  vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
  ::
  emplace_back<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>
            ((vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
              *)&local_78,
             (function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_d8);
  if ((pointer)local_c8._0_8_ != (pointer)0x0) {
    (*(code *)local_c8._0_8_)(&local_d8,&local_d8,3);
  }
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->m_rawArguments).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_rawArguments).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (local_78.
          super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_78.
          super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
LAB_0014fe0e:
        local_d8._8_8_ = (command_line_parser *)0x0;
        local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
        local_c8._16_4_ = 0xffffffff;
        auStack_98._8_8_ = (pointer)0x0;
        auStack_98._16_8_ = 0;
        local_a0._0_4_ = 0;
        local_a0._4_1_ = false;
        local_a0._5_3_ = 0;
        auStack_98._0_8_ = (pointer)0x0;
        local_c8._24_8_ = (options_description *)0x0;
        ppStack_a8 = (positional_options_description *)0x0;
        auStack_98._24_2_ = 0;
        local_d8._M_unused._M_object = (command_line_parser *)local_c8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_c8 + 0x18),
                    (this->m_rawArguments).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_98,
                    (this->m_rawArguments).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
        std::
        vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&local_d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&this->m_rawArguments,
                   (this->m_rawArguments).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_c8 + 0x18));
        if ((command_line_parser *)local_d8._M_unused._0_8_ != (command_line_parser *)local_c8) {
          operator_delete(local_d8._M_unused._M_object,
                          (ulong)((long)&((_Alloc_hider *)local_c8._0_8_)->_M_p + 1));
        }
      }
      else {
        bVar22 = false;
        uVar17 = 0;
        do {
          if (local_78.
              super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar17].super__Function_base._M_manager ==
              (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          pbVar2 = (this->m_rawArguments).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar3 = (this->m_rawArguments).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          (**(code **)(((_Any_data *)
                       (local_78.
                        super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar17))->_M_pod_data + 0x18))
                    ((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                      *)&local_d8,
                     (_Any_data *)
                     (local_78.
                      super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar17),&this->m_rawArguments);
          if (local_d8._M_unused._M_object != (void *)local_d8._8_8_) {
            local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (local_d8._8_8_ - local_d8._0_8_ != 0x60) {
              uVar15 = 0;
              uVar18 = 1;
              do {
                finish_option(this,(option *)(uVar15 * 0x60 + (long)local_d8._M_unused._0_8_),
                              &local_58,&local_78);
                bVar21 = uVar18 < ((long)(local_d8._8_8_ - local_d8._0_8_) >> 5) *
                                  -0x5555555555555555 - 1U;
                uVar15 = uVar18;
                uVar18 = (ulong)((int)uVar18 + 1);
              } while (bVar21);
            }
            finish_option(this,(option *)(local_d8._8_8_ + -0x60),&this->m_rawArguments,&local_78);
            if ((void *)local_d8._8_8_ != local_d8._M_unused._M_object) {
              uVar15 = 0;
              uVar18 = 1;
              do {
                std::
                vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                ::push_back(__return_storage_ptr__,
                            (value_type *)(uVar15 * 0x60 + (long)local_d8._M_unused._0_8_));
                uVar15 = ((long)(local_d8._8_8_ - local_d8._0_8_) >> 5) * -0x5555555555555555;
                bVar21 = uVar18 <= uVar15;
                lVar13 = uVar15 - uVar18;
                uVar15 = uVar18;
                uVar18 = (ulong)((int)uVar18 + 1);
              } while (bVar21 && lVar13 != 0);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_58);
          }
          pbVar4 = (this->m_rawArguments).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar5 = (this->m_rawArguments).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::
          vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ::~vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                     *)&local_d8);
          if ((long)pbVar4 - (long)pbVar5 >> 5 !=
              ((ulong)((long)pbVar2 - (long)pbVar3) >> 5 & 0xffffffff)) {
            bVar22 = true;
            break;
          }
          uVar17 = (ulong)((int)uVar17 + 1);
        } while (uVar17 < (ulong)((long)local_78.
                                        super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_78.
                                        super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
        if (!bVar22) goto LAB_0014fe0e;
      }
    } while ((this->m_rawArguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->m_rawArguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_d8._M_unused._M_object = (pointer)0x0;
  local_d8._8_8_ = (pointer)0x0;
  local_c8._0_8_ = (pointer)0x0;
  pbVar12 = (__return_storage_ptr__->
            super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar19 = (__return_storage_ptr__->
            super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar19 != pbVar12) {
    uVar17 = 0;
    uVar10 = 0;
    do {
      std::
      vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
      ::push_back((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                   *)&local_d8,pbVar12 + uVar17);
      uVar7 = local_d8._8_8_;
      if (*(size_type *)(local_d8._8_8_ + -0x58) != 0) {
        sVar1 = this->m_style;
        this_00 = options_description::find_nothrow
                            (this->m_options_description,(string *)(local_d8._8_8_ + -0x60),
                             (bool)((byte)(sVar1 >> 9) & 1),(bool)((byte)(sVar1 >> 10) & 1),
                             (bool)((byte)(sVar1 >> 0xb) & 1));
        if (this_00 != (option_description *)0x0) {
          option_description::semantic(this_00);
          uVar8 = (**(code **)(((local_58.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                              0x18))();
          if (local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_58.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          option_description::semantic(this_00);
          uVar9 = (**(code **)(((local_58.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                              0x20))();
          if (local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_58.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          if (((uVar8 < uVar9) &&
              (uVar17 = (long)*(pointer *)(uVar7 + -0x30) -
                        (long)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(uVar7 + -0x38))->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5, uVar17 < uVar9)) &&
             (uVar8 = (uint)uVar17, uVar9 != uVar8)) {
            local_38 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(uVar7 + -0x38);
            local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(uVar7 + -0x20);
            iVar16 = uVar8 - uVar9;
            while( true ) {
              uVar8 = uVar10 + 1;
              uVar15 = (ulong)uVar8;
              pbVar12 = (__return_storage_ptr__->
                        super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar17 = ((long)(__return_storage_ptr__->
                              super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5) *
                       -0x5555555555555555;
              if (uVar17 < uVar15 || uVar17 - uVar15 == 0) break;
              bVar22 = pbVar12[uVar15].string_key._M_string_length != 0;
              bVar21 = pbVar12[uVar15].position_key == 0x7fffffff;
              if (bVar21 || bVar22) break;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_38,pbVar12[uVar15].value.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_40,pbVar12[uVar15].original_tokens.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
              if ((bVar21 || bVar22) || (iVar16 = iVar16 + 1, uVar10 = uVar8, iVar16 == 0)) break;
            }
          }
        }
      }
      uVar10 = uVar10 + 1;
      uVar17 = (ulong)uVar10;
      pbVar12 = (__return_storage_ptr__->
                super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar19 = (__return_storage_ptr__->
                super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar15 = ((long)pbVar19 - (long)pbVar12 >> 5) * -0x5555555555555555;
    } while (uVar17 <= uVar15 && uVar15 - uVar17 != 0);
  }
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8._M_unused._0_8_;
  pbVar6 = (__return_storage_ptr__->
           super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8._8_8_;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._0_8_;
  if (local_d8._8_8_ - local_d8._0_8_ != 0) {
    uVar17 = ((long)(local_d8._8_8_ - local_d8._0_8_) >> 5) * -0x5555555555555555;
    piVar11 = (int *)(local_d8._M_unused._M_function_pointer + 0x20);
    iVar16 = 0;
    uVar10 = 1;
    do {
      if (*(size_type *)(piVar11 + -6) == 0) {
        *piVar11 = iVar16;
        iVar16 = iVar16 + 1;
      }
      uVar15 = (ulong)uVar10;
      piVar11 = piVar11 + 0x18;
      uVar10 = uVar10 + 1;
    } while (uVar15 <= uVar17 && uVar17 - uVar15 != 0);
  }
  local_d8._M_unused._0_8_ = (undefined8)pbVar12;
  local_d8._8_8_ = pbVar19;
  local_c8._0_8_ = pbVar6;
  if ((this->m_positional_options_description != (positional_options_description *)0x0) &&
     (pbVar12 = (__return_storage_ptr__->
                super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                )._M_impl.super__Vector_impl_data._M_start,
     (__return_storage_ptr__->
     super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
     )._M_impl.super__Vector_impl_data._M_finish != pbVar12)) {
    uVar10 = 0;
    uVar17 = 0;
    uVar15 = 1;
    do {
      if (pbVar12[uVar17].position_key != -1) {
        uVar8 = positional_options_description::max_total_count
                          (this->m_positional_options_description);
        if (uVar8 <= uVar10) {
          this_01 = (too_many_positional_options_error *)__cxa_allocate_exception(0x10);
          too_many_positional_options_error::too_many_positional_options_error(this_01);
          __cxa_throw(this_01,&too_many_positional_options_error::typeinfo,
                      std::logic_error::~logic_error);
        }
        positional_options_description::name_for_position_abi_cxx11_
                  (this->m_positional_options_description,uVar10);
        std::__cxx11::string::_M_assign((string *)(pbVar12 + uVar17));
        uVar10 = uVar10 + 1;
      }
      pbVar12 = (__return_storage_ptr__->
                super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar17 = ((long)(__return_storage_ptr__->
                      super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5) *
               -0x5555555555555555;
      bVar22 = uVar15 <= uVar17;
      lVar13 = uVar17 - uVar15;
      uVar17 = uVar15;
      uVar15 = (ulong)((int)uVar15 + 1);
    } while (bVar22 && lVar13 != 0);
  }
  pbVar12 = (__return_storage_ptr__->
            super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)(__return_storage_ptr__->
                 super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12;
  if (lVar13 != 0) {
    uVar17 = (lVar13 >> 5) * -0x5555555555555555;
    sVar1 = this->m_style;
    bVar14 = (byte)(sVar1 >> 10);
    uVar10 = 1;
    do {
      uVar15 = (pbVar12->string_key)._M_string_length;
      bVar20 = bVar14;
      if ((uVar15 < 3) && ((uVar15 != 2 || (*(pbVar12->string_key)._M_dataplus._M_p == '-')))) {
        bVar20 = (byte)(sVar1 >> 0xb);
      }
      pbVar12->case_insensitive = (bool)(bVar20 & 1);
      uVar15 = (ulong)uVar10;
      pbVar12 = pbVar12 + 1;
      uVar10 = uVar10 + 1;
    } while (uVar15 <= uVar17 && uVar17 - uVar15 != 0);
  }
  std::
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  ::~vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
             *)&local_d8);
  std::
  vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  ::~vector(&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::vector<option> command_line_parser::run_impl()
{
    using namespace command_line_style;
    // The parsing is done by having a set of 'style parsers'
    // and trying then in order. Each parser is passed a vector
    // of unparsed tokens and can consume some of them (by
    // removing elements on front) and return a vector of options.
    //
    // We try each style parser in turn, untill some input
    // is consumed. The returned vector of option may contain the
    // result of just syntactic parsing of token, say --foo will
    // be parsed as option with name 'foo', and the style parser
    // is not required to care if that option is defined, and how
    // many tokens the value may take.
    // So, after vector is returned, we validate them.
    assert(m_options_description);

    std::vector<style_parser> style_parsers;

    //if (m_style_parser)
    //    style_parsers.push_back(m_style_parser);

    //if (m_additional_parser) {
    //    style_parsers.push_back([this] (std::vector<std::string>& args) {
    //        return this->handle_additional_parser(args);
    //    });
    //}

    if (m_style & allow_long) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_long_option(args);
        });
    }

    if ((m_style & allow_long_disguise)) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_disguised_long_option(args);
        });
    }

    if ((m_style & allow_short) && (m_style & allow_dash_for_short)) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_short_option(args);
        });
    }

    if ((m_style & allow_short) && (m_style & allow_slash_for_short)) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_dos_option(args);
        });
    }

    style_parsers.push_back(
                [this](std::vector<std::string>& args) {
        return parse_terminator(args);
    });

    std::vector<option> result;
    std::vector<std::string>& args = m_rawArguments;

    while(!args.empty())
    {
        bool ok = false;
        for(unsigned i = 0; i < style_parsers.size(); ++i)
        {
            unsigned current_size = static_cast<unsigned>(args.size());
            std::vector<option> next = style_parsers[i](args);

            // Check that option names
            // are valid, and that all values are in place.
            if (!next.empty())
            {
                std::vector<std::string> e;
                for(unsigned k = 0; k < next.size()-1; ++k) {
                    finish_option(next[k], e, style_parsers);
                }
                // For the last option, pass the unparsed tokens
                // so that they can be added to next.back()'s values
                // if appropriate.
                finish_option(next.back(), args, style_parsers);
                for (unsigned j = 0; j < next.size(); ++j)
                    result.push_back(next[j]);
            }

            if (args.size() != current_size) {
                ok = true;
                break;
            }
        }

        if (!ok) {
            option opt;
            opt.value.push_back(args[0]);
            opt.original_tokens.push_back(args[0]);
            result.push_back(opt);
            args.erase(args.begin());
        }
    }

    /* If an key option is followed by a positional option,
       can can consume more tokens (e.g. it's multitoken option),
       give those tokens to it.  */
    std::vector<option> result2;
    for (unsigned i = 0; i < result.size(); ++i)
    {
        result2.push_back(result[i]);
        option& opt = result2.back();

        if (opt.string_key.empty())
            continue;

        const option_description* xd = nullptr;
        try
        {
            xd = m_options_description->find_nothrow(opt.string_key,
                is_style_active(allow_guessing),
                is_style_active(long_case_insensitive),
                is_style_active(short_case_insensitive));
        }
        catch(error_with_option_name& e)
        {
            // add context and rethrow
            e.add_context(opt.string_key, opt.original_tokens[0], get_canonical_option_prefix());
            throw;
        }

        if (!xd)
            continue;

        unsigned min_tokens = xd->semantic()->min_tokens();
        unsigned max_tokens = xd->semantic()->max_tokens();
        if (min_tokens < max_tokens && opt.value.size() < max_tokens)
        {
            // This option may grab some more tokens.
            // We only allow to grab tokens that are not already
            // recognized as key options.

            int can_take_more = max_tokens - static_cast<int>(opt.value.size());
            unsigned j = i+1;
            for (; can_take_more && j < result.size(); --can_take_more, ++j)
            {
                option& opt2 = result[j];
                if (!opt2.string_key.empty())
                    break;

                if (opt2.position_key == INT_MAX)
                {
                    // We use INT_MAX to mark positional options that
                    // were found after the '--' terminator and therefore
                    // should stay positional forever.
                    break;
                }

                assert(opt2.value.size() == 1);

                opt.value.push_back(opt2.value[0]);

                assert(opt2.original_tokens.size() == 1);

                opt.original_tokens.push_back(opt2.original_tokens[0]);
            }
            i = j-1;
        }
    }
    result.swap(result2);


    // Assign position keys to positional options.
    int position_key = 0;
    for(unsigned i = 0; i < result.size(); ++i) {
        if (result[i].string_key.empty())
            result[i].position_key = position_key++;
    }

    if (m_positional_options_description)
    {
        unsigned position = 0;
        for (unsigned i = 0; i < result.size(); ++i) {
            option& opt = result[i];
            if (opt.position_key != -1) {
                if (position >= m_positional_options_description->max_total_count())
                {
                    throw too_many_positional_options_error();
                }
                opt.string_key = m_positional_options_description->name_for_position(position);
                ++position;
            }
        }
    }

    // set case sensitive flag
    for (unsigned i = 0; i < result.size(); ++i) {
        if (result[i].string_key.size() > 2 ||
                (result[i].string_key.size() > 1 && result[i].string_key[0] != '-'))
        {
            // it is a long option
            result[i].case_insensitive = is_style_active(long_case_insensitive);
        }
        else
        {
            // it is a short option
            result[i].case_insensitive = is_style_active(short_case_insensitive);
        }
    }

    return result;
}